

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

bool __thiscall bigint<13>::operator<(bigint<13> *this,bigint<1> *y)

{
  int local_24;
  int i;
  bigint<1> *y_local;
  bigint<13> *this_local;
  
  if (this->len < y->len) {
    this_local._7_1_ = true;
  }
  else if (y->len < this->len) {
    this_local._7_1_ = false;
  }
  else {
    local_24 = this->len;
    do {
      local_24 = local_24 + -1;
      if (local_24 < 0) {
        return false;
      }
      if (this->digits[local_24] < y->digits[local_24]) {
        return true;
      }
    } while (this->digits[local_24] <= y->digits[local_24]);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator<(const bigint<Y_DIGITS> &y) const
    {
        if(len<y.len) return true;
        if(len>y.len) return false;
        for(int i = len-1; i>=0; i--)
        {
            if(digits[i]<y.digits[i]) return true;
            if(digits[i]>y.digits[i]) return false;
        }
        return false;
    }